

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

xmlChar * xmlSaveUri(xmlURIPtr uri)

{
  byte *pbVar1;
  uint uVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar xVar6;
  char cVar7;
  byte bVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  byte *pbVar13;
  int iVar14;
  ulong uVar15;
  xmlChar *pxVar16;
  int max;
  int local_3c;
  xmlURIPtr local_38;
  
  if (uri == (xmlURIPtr)0x0) {
    return (xmlChar *)0x0;
  }
  local_3c = 0x50;
  pxVar3 = (xmlChar *)(*xmlMallocAtomic)(0x51);
  if (pxVar3 == (xmlChar *)0x0) {
    xmlURIErrMemory("saving URI\n");
    return (xmlChar *)0x0;
  }
  pxVar5 = (xmlChar *)uri->scheme;
  local_38 = uri;
  if (pxVar5 == (xmlChar *)0x0) {
    iVar14 = 0;
  }
  else {
    xVar6 = *pxVar5;
    if (xVar6 == '\0') {
      uVar15 = 0;
    }
    else {
      uVar12 = 0;
      do {
        pxVar4 = pxVar3;
        if ((long)local_3c <= (long)uVar12) {
          pxVar4 = xmlSaveUriRealloc(pxVar3,&local_3c);
          pxVar16 = pxVar3;
          if (pxVar4 == (xmlChar *)0x0) goto LAB_0018b0be;
          xVar6 = pxVar5[uVar12];
        }
        uVar15 = uVar12 + 1;
        pxVar4[uVar12] = xVar6;
        xVar6 = pxVar5[uVar12 + 1];
        uVar12 = uVar15;
        pxVar3 = pxVar4;
      } while (xVar6 != '\0');
      if ((local_3c <= (int)uVar15) &&
         (pxVar3 = xmlSaveUriRealloc(pxVar4,&local_3c), pxVar16 = pxVar4, pxVar3 == (xmlChar *)0x0))
      goto LAB_0018b0be;
    }
    iVar14 = (int)uVar15 + 1;
    pxVar3[uVar15 & 0xffffffff] = ':';
  }
  pbVar13 = (byte *)local_38->opaque;
  pxVar16 = pxVar3;
  if (pbVar13 == (byte *)0x0) {
    if ((local_38->server == (char *)0x0) && (local_38->port != -1)) {
      if (local_38->authority == (char *)0x0) {
        if (((local_38->scheme != (char *)0x0) && (local_3c <= iVar14 + 3)) &&
           (pxVar3 = xmlSaveUriRealloc(pxVar3,&local_3c), pxVar3 == (xmlChar *)0x0))
        goto LAB_0018b0be;
      }
      else {
        if ((local_3c <= iVar14 + 3) &&
           (pxVar3 = xmlSaveUriRealloc(pxVar3,&local_3c), pxVar3 == (xmlChar *)0x0))
        goto LAB_0018b0be;
        (pxVar3 + iVar14)[0] = '/';
        (pxVar3 + iVar14)[1] = '/';
        iVar14 = iVar14 + 2;
        bVar8 = *local_38->authority;
        if (bVar8 != 0) {
          pxVar16 = pxVar3;
          iVar11 = iVar14;
          pbVar13 = (byte *)local_38->authority;
          do {
            iVar14 = iVar11 + 3;
            pxVar3 = pxVar16;
            if (local_3c <= iVar14) {
              pxVar3 = xmlSaveUriRealloc(pxVar16,&local_3c);
              if (pxVar3 == (xmlChar *)0x0) goto LAB_0018b0be;
              bVar8 = *pbVar13;
            }
            if (((((byte)(bVar8 - 0x30) < 10) || ((byte)((bVar8 & 0xdf) + 0xbf) < 0x1a)) ||
                ((bVar8 - 0x21 < 0x3f &&
                 ((0x4000000096003fe9U >> ((ulong)(bVar8 - 0x21) & 0x3f) & 1) != 0)))) ||
               (bVar8 == 0x7e)) {
              iVar14 = iVar11 + 1;
              iVar10 = iVar11;
            }
            else {
              pxVar3[iVar11] = '%';
              cVar7 = '0';
              if (0x9f < bVar8) {
                cVar7 = '7';
              }
              iVar10 = iVar11 + 2;
              pxVar3[(long)iVar11 + 1] = cVar7 + (bVar8 >> 4);
              cVar7 = '0';
              if (9 < (bVar8 & 0xf)) {
                cVar7 = '7';
              }
              bVar8 = cVar7 + (bVar8 & 0xf);
            }
            pxVar3[iVar10] = bVar8;
            bVar8 = pbVar13[1];
            pxVar16 = pxVar3;
            iVar11 = iVar14;
            pbVar13 = pbVar13 + 1;
          } while (bVar8 != 0);
        }
      }
    }
    else {
      pxVar5 = pxVar3;
      if ((local_3c <= iVar14 + 3) &&
         (pxVar5 = xmlSaveUriRealloc(pxVar3,&local_3c), pxVar5 == (xmlChar *)0x0))
      goto LAB_0018b0be;
      (pxVar5 + iVar14)[0] = '/';
      (pxVar5 + iVar14)[1] = '/';
      iVar14 = iVar14 + 2;
      pbVar13 = (byte *)local_38->user;
      if (pbVar13 != (byte *)0x0) {
        bVar8 = *pbVar13;
        if (bVar8 != 0) {
          pxVar16 = pxVar5;
          do {
            pxVar5 = pxVar16;
            if (local_3c <= iVar14 + 3) {
              pxVar5 = xmlSaveUriRealloc(pxVar16,&local_3c);
              if (pxVar5 == (xmlChar *)0x0) goto LAB_0018b0be;
              bVar8 = *pbVar13;
            }
            if (((((byte)(bVar8 - 0x30) < 10) || ((byte)((bVar8 & 0xdf) + 0xbf) < 0x1a)) ||
                ((bVar8 - 0x21 < 0x3f &&
                 ((0x4000000016003fe9U >> ((ulong)(bVar8 - 0x21) & 0x3f) & 1) != 0)))) ||
               (bVar8 == 0x7e)) {
              iVar11 = iVar14;
              iVar14 = iVar14 + 1;
            }
            else {
              pxVar5[iVar14] = '%';
              cVar7 = '0';
              if (0x9f < bVar8) {
                cVar7 = '7';
              }
              iVar11 = iVar14 + 2;
              pxVar5[(long)iVar14 + 1] = cVar7 + (bVar8 >> 4);
              cVar7 = '0';
              if (9 < (bVar8 & 0xf)) {
                cVar7 = '7';
              }
              bVar8 = cVar7 + (bVar8 & 0xf);
              iVar14 = iVar14 + 3;
            }
            pxVar5[iVar11] = bVar8;
            bVar8 = pbVar13[1];
            pxVar16 = pxVar5;
            pbVar13 = pbVar13 + 1;
          } while (bVar8 != 0);
        }
        pxVar3 = pxVar5;
        if ((local_3c <= iVar14 + 3) &&
           (pxVar3 = xmlSaveUriRealloc(pxVar5,&local_3c), pxVar16 = pxVar5, pxVar3 == (xmlChar *)0x0
           )) goto LAB_0018b0be;
        lVar9 = (long)iVar14;
        iVar14 = iVar14 + 1;
        pxVar3[lVar9] = '@';
        pxVar5 = pxVar3;
      }
      pxVar4 = (xmlChar *)local_38->server;
      pxVar3 = pxVar5;
      if (pxVar4 != (xmlChar *)0x0) {
        xVar6 = *pxVar4;
        if (xVar6 != '\0') {
          lVar9 = (long)iVar14;
          pxVar16 = pxVar5;
          do {
            pxVar5 = pxVar16;
            if (local_3c <= lVar9) {
              pxVar5 = xmlSaveUriRealloc(pxVar16,&local_3c);
              if (pxVar5 == (xmlChar *)0x0) goto LAB_0018b0be;
              xVar6 = *pxVar4;
            }
            pxVar5[lVar9] = xVar6;
            lVar9 = lVar9 + 1;
            xVar6 = pxVar4[1];
            iVar14 = iVar14 + 1;
            pxVar16 = pxVar5;
            pxVar4 = pxVar4 + 1;
          } while (xVar6 != '\0');
        }
        uVar2 = local_38->port;
        pxVar3 = pxVar5;
        if (0 < (int)uVar2) {
          if (local_3c <= iVar14 + 10) {
            pxVar3 = xmlSaveUriRealloc(pxVar5,&local_3c);
            pxVar16 = pxVar5;
            if (pxVar3 == (xmlChar *)0x0) goto LAB_0018b0be;
            uVar2 = local_38->port;
          }
          iVar11 = snprintf((char *)(pxVar3 + iVar14),(long)(local_3c - iVar14),":%d",(ulong)uVar2);
          iVar14 = iVar11 + iVar14;
        }
      }
    }
    pbVar13 = (byte *)local_38->path;
    if (pbVar13 != (byte *)0x0) {
      if ((xmlChar *)local_38->scheme == (xmlChar *)0x0) {
LAB_0018ace5:
        bVar8 = *pbVar13;
      }
      else {
        bVar8 = *pbVar13;
        if (bVar8 == 0x2f) {
          if ((((byte)((pbVar13[1] & 0xdf) + 0xbf) < 0x1a) && (pbVar13[2] == 0x3a)) &&
             (iVar11 = xmlStrEqual((xmlChar *)local_38->scheme,"file"), iVar11 != 0)) {
            pxVar5 = pxVar3;
            if ((local_3c <= iVar14 + 3) &&
               (pxVar5 = xmlSaveUriRealloc(pxVar3,&local_3c), pxVar16 = pxVar3,
               pxVar5 == (xmlChar *)0x0)) goto LAB_0018b0be;
            pxVar5[iVar14] = *pbVar13;
            pxVar5[(long)iVar14 + 1] = pbVar13[1];
            pbVar1 = pbVar13 + 2;
            pbVar13 = pbVar13 + 3;
            pxVar5[(long)iVar14 + 2] = *pbVar1;
            pxVar3 = pxVar5;
            iVar14 = iVar14 + 3;
          }
          goto LAB_0018ace5;
        }
      }
      if (bVar8 != 0) {
        pxVar16 = pxVar3;
        do {
          pxVar3 = pxVar16;
          if (local_3c <= iVar14 + 3) {
            pxVar3 = xmlSaveUriRealloc(pxVar16,&local_3c);
            if (pxVar3 == (xmlChar *)0x0) goto LAB_0018b0be;
            bVar8 = *pbVar13;
          }
          if (((((byte)(bVar8 - 0x30) < 10) || ((byte)((bVar8 & 0xdf) + 0xbf) < 0x1a)) ||
              ((bVar8 - 0x21 < 0x3f &&
               ((0x4000000094007fe9U >> ((ulong)(bVar8 - 0x21) & 0x3f) & 1) != 0)))) ||
             (bVar8 == 0x7e)) {
            iVar11 = iVar14;
            iVar14 = iVar14 + 1;
          }
          else {
            pxVar3[iVar14] = '%';
            cVar7 = '0';
            if (0x9f < bVar8) {
              cVar7 = '7';
            }
            iVar11 = iVar14 + 2;
            pxVar3[(long)iVar14 + 1] = cVar7 + (bVar8 >> 4);
            cVar7 = '0';
            if (9 < (bVar8 & 0xf)) {
              cVar7 = '7';
            }
            bVar8 = cVar7 + (bVar8 & 0xf);
            iVar14 = iVar14 + 3;
          }
          pxVar3[iVar11] = bVar8;
          bVar8 = pbVar13[1];
          pxVar16 = pxVar3;
          pbVar13 = pbVar13 + 1;
        } while (bVar8 != 0);
      }
    }
    pxVar5 = pxVar3;
    pxVar16 = pxVar3;
    if (local_38->query_raw == (char *)0x0) {
      if (local_38->query != (char *)0x0) {
        if ((local_3c <= iVar14 + 3) &&
           (pxVar5 = xmlSaveUriRealloc(pxVar3,&local_3c), pxVar5 == (xmlChar *)0x0))
        goto LAB_0018b0be;
        pxVar5[iVar14] = '?';
        bVar8 = *local_38->query;
        if (bVar8 == 0) goto LAB_0018b05e;
        iVar14 = iVar14 + 1;
        pbVar13 = (byte *)local_38->query;
        do {
          pxVar3 = pxVar5;
          if (local_3c <= iVar14 + 3) {
            pxVar3 = xmlSaveUriRealloc(pxVar5,&local_3c);
            pxVar16 = pxVar5;
            if (pxVar3 == (xmlChar *)0x0) goto LAB_0018b0be;
            bVar8 = *pbVar13;
          }
          if (((((byte)(bVar8 - 0x30) < 10) || ((byte)((bVar8 & 0xdf) + 0xbf) < 0x1a)) ||
              ((bVar8 - 0x21 < 0x3f &&
               ((0x54000000d6007fe9U >> ((ulong)(bVar8 - 0x21) & 0x3f) & 1) != 0)))) ||
             (bVar8 == 0x7e)) {
            iVar11 = iVar14;
            iVar14 = iVar14 + 1;
          }
          else {
            pxVar3[iVar14] = '%';
            cVar7 = '0';
            if (0x9f < bVar8) {
              cVar7 = '7';
            }
            iVar11 = iVar14 + 2;
            pxVar3[(long)iVar14 + 1] = cVar7 + (bVar8 >> 4);
            cVar7 = '0';
            if (9 < (bVar8 & 0xf)) {
              cVar7 = '7';
            }
            bVar8 = cVar7 + (bVar8 & 0xf);
            iVar14 = iVar14 + 3;
          }
          pxVar3[iVar11] = bVar8;
          bVar8 = pbVar13[1];
          pxVar5 = pxVar3;
          pbVar13 = pbVar13 + 1;
        } while (bVar8 != 0);
      }
    }
    else {
      iVar11 = iVar14 + 1;
      if ((local_3c <= iVar11) &&
         (pxVar5 = xmlSaveUriRealloc(pxVar3,&local_3c), pxVar5 == (xmlChar *)0x0))
      goto LAB_0018b0be;
      pxVar5[iVar14] = '?';
      xVar6 = *local_38->query_raw;
      if (xVar6 == '\0') {
LAB_0018b05e:
        iVar14 = iVar14 + 1;
        pxVar3 = pxVar5;
      }
      else {
        pxVar4 = (xmlChar *)local_38->query_raw;
        lVar9 = (long)iVar11;
        iVar14 = iVar11;
        do {
          pxVar3 = pxVar5;
          if ((long)local_3c <= lVar9 + 1) {
            pxVar3 = xmlSaveUriRealloc(pxVar5,&local_3c);
            pxVar16 = pxVar5;
            if (pxVar3 == (xmlChar *)0x0) goto LAB_0018b0be;
            xVar6 = *pxVar4;
          }
          pxVar3[lVar9] = xVar6;
          xVar6 = pxVar4[1];
          iVar14 = iVar14 + 1;
          pxVar5 = pxVar3;
          pxVar4 = pxVar4 + 1;
          lVar9 = lVar9 + 1;
        } while (xVar6 != '\0');
      }
    }
  }
  else {
    bVar8 = *pbVar13;
    if (bVar8 != 0) {
      do {
        pxVar3 = pxVar16;
        if (local_3c <= iVar14 + 3) {
          pxVar3 = xmlSaveUriRealloc(pxVar16,&local_3c);
          if (pxVar3 == (xmlChar *)0x0) goto LAB_0018b0be;
          bVar8 = *pbVar13;
        }
        if ((((((bVar8 - 0x24 < 0x3a) &&
               ((0x28000001ac00985U >> ((ulong)(bVar8 - 0x24) & 0x3f) & 1) != 0)) ||
              ((byte)(bVar8 - 0x30) < 10)) || ((byte)((bVar8 & 0xdf) + 0xbf) < 0x1a)) ||
            ((bVar8 - 0x21 < 0x3f &&
             ((0x40000000000033c1U >> ((ulong)(bVar8 - 0x21) & 0x3f) & 1) != 0)))) ||
           (bVar8 == 0x7e)) {
          iVar11 = iVar14;
          iVar14 = iVar14 + 1;
        }
        else {
          pxVar3[iVar14] = '%';
          cVar7 = '0';
          if (0x9f < bVar8) {
            cVar7 = '7';
          }
          iVar11 = iVar14 + 2;
          pxVar3[(long)iVar14 + 1] = cVar7 + (bVar8 >> 4);
          cVar7 = '0';
          if (9 < (bVar8 & 0xf)) {
            cVar7 = '7';
          }
          bVar8 = cVar7 + (bVar8 & 0xf);
          iVar14 = iVar14 + 3;
        }
        pxVar3[iVar11] = bVar8;
        bVar8 = pbVar13[1];
        pxVar16 = pxVar3;
        pbVar13 = pbVar13 + 1;
      } while (bVar8 != 0);
    }
  }
  pxVar5 = pxVar3;
  if (local_38->fragment != (char *)0x0) {
    if ((local_3c <= iVar14 + 3) &&
       (pxVar5 = xmlSaveUriRealloc(pxVar3,&local_3c), pxVar16 = pxVar3, pxVar5 == (xmlChar *)0x0))
    goto LAB_0018b0be;
    lVar9 = (long)iVar14;
    iVar14 = iVar14 + 1;
    pxVar5[lVar9] = '#';
    bVar8 = *local_38->fragment;
    if (bVar8 != 0) {
      pxVar16 = pxVar5;
      pbVar13 = (byte *)local_38->fragment;
      do {
        pxVar5 = pxVar16;
        if (local_3c <= iVar14 + 3) {
          pxVar5 = xmlSaveUriRealloc(pxVar16,&local_3c);
          if (pxVar5 == (xmlChar *)0x0) goto LAB_0018b0be;
          bVar8 = *pbVar13;
        }
        if (((((byte)(bVar8 - 0x30) < 10) || ((byte)((bVar8 & 0xdf) + 0xbf) < 0x1a)) ||
            ((bVar8 - 0x21 < 0x3f &&
             ((0x54000000d6007fe9U >> ((ulong)(bVar8 - 0x21) & 0x3f) & 1) != 0)))) ||
           (bVar8 == 0x7e)) {
          iVar11 = iVar14;
          iVar14 = iVar14 + 1;
        }
        else {
          pxVar5[iVar14] = '%';
          cVar7 = '0';
          if (0x9f < bVar8) {
            cVar7 = '7';
          }
          iVar11 = iVar14 + 2;
          pxVar5[(long)iVar14 + 1] = cVar7 + (bVar8 >> 4);
          cVar7 = '0';
          if (9 < (bVar8 & 0xf)) {
            cVar7 = '7';
          }
          bVar8 = cVar7 + (bVar8 & 0xf);
          iVar14 = iVar14 + 3;
        }
        pxVar5[iVar11] = bVar8;
        bVar8 = pbVar13[1];
        pxVar16 = pxVar5;
        pbVar13 = pbVar13 + 1;
      } while (bVar8 != 0);
    }
  }
  pxVar3 = pxVar5;
  if ((iVar14 < local_3c) ||
     (pxVar3 = xmlSaveUriRealloc(pxVar5,&local_3c), pxVar16 = pxVar5, pxVar3 != (xmlChar *)0x0)) {
    pxVar3[iVar14] = '\0';
    return pxVar3;
  }
LAB_0018b0be:
  (*xmlFree)(pxVar16);
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlSaveUri(xmlURIPtr uri) {
    xmlChar *ret = NULL;
    xmlChar *temp;
    const char *p;
    int len;
    int max;

    if (uri == NULL) return(NULL);


    max = 80;
    ret = (xmlChar *) xmlMallocAtomic(max + 1);
    if (ret == NULL) {
        xmlURIErrMemory("saving URI\n");
	return(NULL);
    }
    len = 0;

    if (uri->scheme != NULL) {
	p = uri->scheme;
	while (*p != 0) {
	    if (len >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
		ret = temp;
	    }
	    ret[len++] = *p++;
	}
	if (len >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = ':';
    }
    if (uri->opaque != NULL) {
	p = uri->opaque;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if (IS_RESERVED(*(p)) || IS_UNRESERVED(*(p)))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    } else {
	if ((uri->server != NULL) || (uri->port == -1)) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    if (uri->user != NULL) {
		p = uri->user;
		while (*p != 0) {
		    if (len + 3 >= max) {
                        temp = xmlSaveUriRealloc(ret, &max);
                        if (temp == NULL) goto mem_error;
                        ret = temp;
		    }
		    if ((IS_UNRESERVED(*(p))) ||
			((*(p) == ';')) || ((*(p) == ':')) ||
			((*(p) == '&')) || ((*(p) == '=')) ||
			((*(p) == '+')) || ((*(p) == '$')) ||
			((*(p) == ',')))
			ret[len++] = *p++;
		    else {
			int val = *(unsigned char *)p++;
			int hi = val / 0x10, lo = val % 0x10;
			ret[len++] = '%';
			ret[len++] = hi + (hi > 9? 'A'-10 : '0');
			ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		    }
		}
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = '@';
	    }
	    if (uri->server != NULL) {
		p = uri->server;
		while (*p != 0) {
		    if (len >= max) {
			temp = xmlSaveUriRealloc(ret, &max);
			if (temp == NULL) goto mem_error;
			ret = temp;
		    }
		    ret[len++] = *p++;
		}
		if (uri->port > 0) {
		    if (len + 10 >= max) {
			temp = xmlSaveUriRealloc(ret, &max);
			if (temp == NULL) goto mem_error;
			ret = temp;
		    }
		    len += snprintf((char *) &ret[len], max - len, ":%d", uri->port);
		}
	    }
	} else if (uri->authority != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    p = uri->authority;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) ||
                    ((*(p) == '$')) || ((*(p) == ',')) || ((*(p) == ';')) ||
                    ((*(p) == ':')) || ((*(p) == '@')) || ((*(p) == '&')) ||
                    ((*(p) == '=')) || ((*(p) == '+')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	} else if (uri->scheme != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	}
	if (uri->path != NULL) {
	    p = uri->path;
	    /*
	     * the colon in file:///d: should not be escaped or
	     * Windows accesses fail later.
	     */
	    if ((uri->scheme != NULL) &&
		(p[0] == '/') &&
		(((p[1] >= 'a') && (p[1] <= 'z')) ||
		 ((p[1] >= 'A') && (p[1] <= 'Z'))) &&
		(p[2] == ':') &&
	        (xmlStrEqual(BAD_CAST uri->scheme, BAD_CAST "file"))) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
		ret[len++] = *p++;
		ret[len++] = *p++;
	    }
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || ((*(p) == '/')) ||
                    ((*(p) == ';')) || ((*(p) == '@')) || ((*(p) == '&')) ||
	            ((*(p) == '=')) || ((*(p) == '+')) || ((*(p) == '$')) ||
	            ((*(p) == ',')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
	if (uri->query_raw != NULL) {
	    if (len + 1 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query_raw;
	    while (*p != 0) {
		if (len + 1 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
	    }
	} else if (uri->query != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
    }
    if (uri->fragment != NULL) {
	if (len + 3 >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = '#';
	p = uri->fragment;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    }
    if (len >= max) {
        temp = xmlSaveUriRealloc(ret, &max);
        if (temp == NULL) goto mem_error;
        ret = temp;
    }
    ret[len] = 0;
    return(ret);

mem_error:
    xmlFree(ret);
    return(NULL);
}